

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_bitset.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_> local_d;
  undefined4 local_c;
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  color_bitset;
  
  local_c = 0;
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::bitset
            (&local_d);
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::set
            (&local_d,GREEN,true);
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::set
            (&local_d,BLUE,true);
  std::ostream::operator<<((ostream *)&std::cout,std::boolalpha);
  sVar2 = magic_enum::containers::
          bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
          size(&local_d);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = magic_enum::containers::
          bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
          all(&local_d);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = magic_enum::containers::
          bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
          any(&local_d);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = magic_enum::containers::
          bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
          none(&local_d);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar2 = magic_enum::containers::
          bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
          count(&local_d);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = magic_enum::containers::
          bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
          test(&local_d,RED);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = magic_enum::containers::
          bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
          test(&local_d,GREEN);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = magic_enum::containers::
          bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
          test(&local_d,BLUE);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {

  auto color_bitset = magic_enum::containers::bitset<Color>();
  color_bitset.set(Color::GREEN);
  color_bitset.set(Color::BLUE);

  std::cout << std::boolalpha;
  std::cout << color_bitset.size() << std::endl; // 3 == magic_enum::enum_count<Color>()
  std::cout << color_bitset.all() << std::endl; // false
  std::cout << color_bitset.any() << std::endl; // true
  std::cout << color_bitset.none() << std::endl; // false
  std::cout << color_bitset.count() << std::endl; // 2
  std::cout << color_bitset.test(Color::RED) << std::endl; // false
  std::cout << color_bitset.test(Color::GREEN) << std::endl; // true
  std::cout << color_bitset.test(Color::BLUE) << std::endl; // true

  return 0;
}